

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O3

void __thiscall StringTest::Test3(StringTest *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong __n;
  string t1;
  string t2;
  string t3;
  string t4;
  long *local_b0;
  ulong local_a8;
  long local_a0 [2];
  long *local_90;
  ulong local_88;
  long local_80 [2];
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"abc","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"def","");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"abc","");
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"abcdef","");
  uVar6 = local_88;
  __n = local_a8;
  uVar4 = local_a8;
  if (local_88 < local_a8) {
    uVar4 = local_88;
  }
  if (uVar4 == 0) {
LAB_0010422c:
    uVar5 = __n - uVar6;
    uVar3 = 0xffffffff80000000;
    if (-0x80000000 < (long)uVar5) {
      uVar3 = uVar5;
    }
    if (0x7ffffffe < (long)uVar3) {
      uVar3 = 0x7fffffff;
    }
  }
  else {
    uVar1 = memcmp(local_b0,local_90,uVar4);
    uVar3 = (ulong)uVar1;
    if (uVar1 == 0) goto LAB_0010422c;
  }
  if ((-1 < (int)uVar3) &&
     (TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
                 ,0xc1,"t1 compare t2"), uVar6 = local_88, __n = local_a8, uVar4 = local_88,
     local_a8 < local_88)) {
    uVar4 = local_a8;
  }
  if (uVar4 == 0) {
LAB_001042a0:
    uVar4 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar6 - __n)) {
      uVar4 = uVar6 - __n;
    }
    if (0x7ffffffe < (long)uVar4) {
      uVar4 = 0x7fffffff;
    }
  }
  else {
    uVar1 = memcmp(local_90,local_b0,uVar4);
    uVar4 = (ulong)uVar1;
    if (uVar1 == 0) goto LAB_001042a0;
  }
  if ((int)uVar4 < 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xc4,"t2 compare t1");
    __n = local_a8;
  }
  uVar6 = local_68;
  uVar4 = __n;
  if (local_68 < __n) {
    uVar4 = local_68;
  }
  if (uVar4 == 0) {
    if (__n != local_68) goto LAB_0010431a;
  }
  else {
    iVar2 = bcmp(local_b0,local_70,uVar4);
    if ((__n != uVar6) || (iVar2 != 0)) {
LAB_0010431a:
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
                 ,199,"t1 compare t3");
      __n = local_a8;
    }
  }
  uVar6 = local_48;
  uVar4 = __n;
  if (local_48 < __n) {
    uVar4 = local_48;
  }
  if (uVar4 == 0) {
LAB_00104366:
    uVar5 = __n - uVar6;
    uVar3 = 0xffffffff80000000;
    if (-0x80000000 < (long)uVar5) {
      uVar3 = uVar5;
    }
    if (0x7ffffffe < (long)uVar3) {
      uVar3 = 0x7fffffff;
    }
  }
  else {
    uVar1 = memcmp(local_b0,local_50,uVar4);
    uVar3 = (ulong)uVar1;
    if (uVar1 == 0) goto LAB_00104366;
  }
  if ((-1 < (int)uVar3) &&
     (TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
                 ,0xca,"t1 compare t4"), uVar6 = local_48, __n = local_a8, uVar4 = local_48,
     local_a8 < local_48)) {
    uVar4 = local_a8;
  }
  if (uVar4 == 0) {
LAB_001043da:
    uVar4 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar6 - __n)) {
      uVar4 = uVar6 - __n;
    }
    if (0x7ffffffe < (long)uVar4) {
      uVar4 = 0x7fffffff;
    }
  }
  else {
    uVar1 = memcmp(local_50,local_b0,uVar4);
    uVar4 = (ulong)uVar1;
    if (uVar1 == 0) goto LAB_001043da;
  }
  if ((int)uVar4 < 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xcd,"t4 compare t1");
    __n = local_a8;
  }
  if (__n == local_68) {
    if (__n != 0) {
      iVar2 = bcmp(local_b0,local_70,__n);
      if (iVar2 != 0) goto LAB_00104443;
      goto LAB_00104465;
    }
    if (local_88 != 0) goto LAB_001044ae;
  }
  else {
LAB_00104443:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xd0,"t1 != t3");
    __n = local_a8;
LAB_00104465:
    if ((__n != local_88) || ((__n != 0 && (iVar2 = bcmp(local_b0,local_90,__n), iVar2 != 0))))
    goto LAB_001044ae;
  }
  TestCase::TestFailedInternal
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
             ,0xd3,"t1 == t2");
LAB_001044ae:
  iVar2 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar2 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xd6,"t1 != abc");
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar2 == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xd9,"t1 == def");
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar2 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xdc,"abc != t1");
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar2 == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xdf,"def == t1");
  }
  TestCase::TestPassed(&this->super_TestCase);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return;
}

Assistant:

void Test3()
	{
		string t1 = "abc";
		string t2 = "def";
		string t3 = "abc";
		string t4 = "abcdef";
		
		if ( t1.compare( t2 ) >= 0 )
			TestFailed( "t1 compare t2" );
		
		if ( t2.compare( t1 ) <= 0 )
			TestFailed( "t2 compare t1" );

		if ( t1.compare( t3 ) != 0 )
			TestFailed( "t1 compare t3" );

		if ( t1.compare( t4 ) >= 0 )
			TestFailed( "t1 compare t4" );

		if ( t4.compare( t1 ) <= 0 )
			TestFailed( "t4 compare t1" );

		if ( t1 != t3 )
			TestFailed( "t1 != t3" );

		if ( t1 == t2 )
			TestFailed( "t1 == t2" );

		if ( t1 != "abc" )
			TestFailed( "t1 != abc" );

		if ( t1 == "def" )
			TestFailed( "t1 == def" );

		if ( "abc" != t1 )
			TestFailed( "abc != t1" );

		if ( "def" == t1 )
			TestFailed( "def == t1" );
		
		TestPassed();
	}